

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void correct_reed_solomon_decoder_create(correct_reed_solomon *rs)

{
  size_t sVar1;
  size_t sVar2;
  field_element_t *pfVar3;
  field_logarithm_t *pfVar4;
  field_logarithm_t **ppfVar5;
  uint uVar6;
  field_operation_t i;
  ulong uVar7;
  long lVar8;
  polynomial_t pVar9;
  
  rs->has_init_decode = true;
  sVar1 = rs->min_distance;
  pfVar3 = (field_element_t *)calloc(sVar1,1);
  rs->syndromes = pfVar3;
  pfVar3 = (field_element_t *)calloc(sVar1 * 2,1);
  rs->modified_syndromes = pfVar3;
  pVar9 = polynomial_create((int)rs->block_length - 1);
  (rs->received_polynomial).coeff = pVar9.coeff;
  (rs->received_polynomial).order = pVar9.order;
  pVar9 = polynomial_create((uint)rs->min_distance);
  (rs->error_locator).coeff = pVar9.coeff;
  (rs->error_locator).order = pVar9.order;
  pVar9 = polynomial_create((uint)rs->min_distance);
  (rs->error_locator_log).coeff = pVar9.coeff;
  (rs->error_locator_log).order = pVar9.order;
  pVar9 = polynomial_create((uint)rs->min_distance);
  (rs->erasure_locator).coeff = pVar9.coeff;
  (rs->erasure_locator).order = pVar9.order;
  sVar1 = rs->min_distance;
  pfVar3 = (field_element_t *)calloc(sVar1 * 2,1);
  rs->error_roots = pfVar3;
  pfVar3 = (field_element_t *)malloc(sVar1);
  rs->error_vals = pfVar3;
  pfVar4 = (field_logarithm_t *)malloc(sVar1);
  rs->error_locations = pfVar4;
  pVar9 = polynomial_create((uint)sVar1);
  (rs->last_error_locator).coeff = pVar9.coeff;
  (rs->last_error_locator).order = pVar9.order;
  pVar9 = polynomial_create((int)rs->min_distance - 1);
  (rs->error_evaluator).coeff = pVar9.coeff;
  (rs->error_evaluator).order = pVar9.order;
  pVar9 = polynomial_create((int)rs->min_distance - 1);
  (rs->error_locator_derivative).coeff = pVar9.coeff;
  (rs->error_locator_derivative).order = pVar9.order;
  sVar2 = rs->min_distance;
  ppfVar5 = (field_logarithm_t **)malloc(sVar2 * 8);
  rs->generator_root_exp = ppfVar5;
  if (sVar2 != 0) {
    uVar6 = 1;
    uVar7 = 0;
    do {
      sVar1 = rs->block_length;
      pfVar4 = (field_logarithm_t *)malloc(sVar1);
      rs->generator_root_exp[uVar7] = pfVar4;
      polynomial_build_exp_lut
                (rs->field,rs->generator_roots[uVar7],(int)sVar1 - 1,rs->generator_root_exp[uVar7]);
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar7 < rs->min_distance);
  }
  ppfVar5 = (field_logarithm_t **)malloc(0x800);
  rs->element_exp = ppfVar5;
  lVar8 = 0;
  do {
    sVar1 = rs->min_distance;
    pfVar4 = (field_logarithm_t *)malloc(sVar1);
    rs->element_exp[lVar8] = pfVar4;
    polynomial_build_exp_lut(rs->field,(field_element_t)lVar8,(int)sVar1 - 1,rs->element_exp[lVar8])
    ;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  pVar9 = polynomial_create((uint)rs->min_distance);
  rs->init_from_roots_scratch[0].coeff = pVar9.coeff;
  rs->init_from_roots_scratch[0].order = pVar9.order;
  pVar9 = polynomial_create((uint)rs->min_distance);
  rs->init_from_roots_scratch[1].coeff = pVar9.coeff;
  rs->init_from_roots_scratch[1].order = pVar9.order;
  return;
}

Assistant:

void correct_reed_solomon_decoder_create(correct_reed_solomon *rs) {
    rs->has_init_decode = true;
    rs->syndromes = calloc(rs->min_distance, sizeof(field_element_t));
    rs->modified_syndromes = calloc(2 * rs->min_distance, sizeof(field_element_t));
    rs->received_polynomial = polynomial_create(rs->block_length - 1);
    rs->error_locator = polynomial_create(rs->min_distance);
    rs->error_locator_log = polynomial_create(rs->min_distance);
    rs->erasure_locator = polynomial_create(rs->min_distance);
    rs->error_roots = calloc(2 * rs->min_distance, sizeof(field_element_t));
    rs->error_vals = malloc(rs->min_distance * sizeof(field_element_t));
    rs->error_locations = malloc(rs->min_distance * sizeof(field_logarithm_t));

    rs->last_error_locator = polynomial_create(rs->min_distance);
    rs->error_evaluator = polynomial_create(rs->min_distance - 1);
    rs->error_locator_derivative = polynomial_create(rs->min_distance - 1);

    // calculate and store the first block_length powers of every generator root
    // we would have to do this work in order to calculate the syndromes
    // if we save it, we can prevent the need to recalculate it on subsequent calls
    // total memory usage is min_distance * block_length bytes e.g. 32 * 255 ~= 8k
    rs->generator_root_exp = malloc(rs->min_distance * sizeof(field_logarithm_t *));
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        rs->generator_root_exp[i] = malloc(rs->block_length * sizeof(field_logarithm_t));
        polynomial_build_exp_lut(rs->field, rs->generator_roots[i], rs->block_length - 1, rs->generator_root_exp[i]);
    }

    // calculate and store the first min_distance powers of every element in the field
    // we would have to do this for chien search anyway, and its size is only 256 * min_distance bytes
    // for min_distance = 32 this is 8k of memory, a pittance for the speedup we receive in exchange
    // we also get to reuse this work during error value calculation
    rs->element_exp = malloc(256 * sizeof(field_logarithm_t *));
    for (field_operation_t i = 0; i < 256; i++) {
        rs->element_exp[i] = malloc(rs->min_distance * sizeof(field_logarithm_t));
        polynomial_build_exp_lut(rs->field, i, rs->min_distance - 1, rs->element_exp[i]);
    }

    rs->init_from_roots_scratch[0] = polynomial_create(rs->min_distance);
    rs->init_from_roots_scratch[1] = polynomial_create(rs->min_distance);
}